

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-tcp-open.c
# Opt level: O0

int run_test_tcp_open_twice(void)

{
  uv_os_sock_t uVar1;
  uv_os_sock_t sock;
  int iVar2;
  undefined8 uVar3;
  uv_loop_t *loop;
  int64_t eval_b_3;
  int64_t eval_a_3;
  int64_t eval_b_2;
  int64_t eval_a_2;
  int64_t eval_b_1;
  int64_t eval_a_1;
  int64_t eval_b;
  int64_t eval_a;
  int r;
  uv_os_sock_t sock2;
  uv_os_sock_t sock1;
  uv_tcp_t client;
  
  startup();
  uVar1 = create_tcp_socket();
  sock = create_tcp_socket();
  uVar3 = uv_default_loop();
  iVar2 = uv_tcp_init(uVar3,&sock2);
  if ((long)iVar2 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-tcp-open.c"
            ,0x127,"r","==","0",(long)iVar2,"==",0);
    abort();
  }
  iVar2 = uv_tcp_open(&sock2,uVar1);
  if ((long)iVar2 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-tcp-open.c"
            ,0x12a,"r","==","0",(long)iVar2,"==",0);
    abort();
  }
  iVar2 = uv_tcp_open(&sock2,sock);
  if ((long)iVar2 != -0x10) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-tcp-open.c"
            ,0x12d,"r","==","UV_EBUSY",(long)iVar2,"==",0xfffffffffffffff0);
    abort();
  }
  close_socket(sock);
  uv_close(&sock2,0);
  uVar3 = uv_default_loop();
  uv_run(uVar3,0);
  loop = (uv_loop_t *)uv_default_loop();
  close_loop(loop);
  uVar3 = uv_default_loop();
  iVar2 = uv_loop_close(uVar3);
  if ((long)iVar2 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-tcp-open.c"
            ,0x133,"0","==","uv_loop_close(uv_default_loop())",0,"==",(long)iVar2);
    abort();
  }
  uv_library_shutdown();
  return 0;
}

Assistant:

TEST_IMPL(tcp_open_twice) {
  uv_tcp_t client;
  uv_os_sock_t sock1, sock2;
  int r;

  startup();
  sock1 = create_tcp_socket();
  sock2 = create_tcp_socket();

  r = uv_tcp_init(uv_default_loop(), &client);
  ASSERT_OK(r);

  r = uv_tcp_open(&client, sock1);
  ASSERT_OK(r);

  r = uv_tcp_open(&client, sock2);
  ASSERT_EQ(r, UV_EBUSY);
  close_socket(sock2);

  uv_close((uv_handle_t*) &client, NULL);
  uv_run(uv_default_loop(), UV_RUN_DEFAULT);

  MAKE_VALGRIND_HAPPY(uv_default_loop());
  return 0;
}